

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall kj::HttpServer::listenLoop(HttpServer *this,ConnectionReceiver *port)

{
  undefined8 *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  ConnectionReceiver *local_40;
  undefined8 *local_38;
  Type local_30;
  undefined8 *local_20;
  ConnectionReceiver *port_local;
  HttpServer *this_local;
  
  local_20 = in_RDX;
  port_local = port;
  this_local = this;
  (**(code **)*in_RDX)();
  local_38 = local_20;
  local_40 = port;
  Promise<kj::Own<kj::AsyncIoStream>>::
  then<kj::HttpServer::listenLoop(kj::ConnectionReceiver&)::__0,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncIoStream>> *)this,&local_30,(PropagateException *)&local_40);
  Promise<kj::Own<kj::AsyncIoStream>_>::~Promise((Promise<kj::Own<kj::AsyncIoStream>_> *)&local_30);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpServer::listenLoop(kj::ConnectionReceiver& port) {
  return port.accept()
      .then([this,&port](kj::Own<kj::AsyncIoStream>&& connection) -> kj::Promise<void> {
    if (draining) {
      // Can get here if we *just* started draining.
      return kj::READY_NOW;
    }

    tasks.add(listenHttp(kj::mv(connection)));
    return listenLoop(port);
  });
}